

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_proxy_module.c
# Opt level: O0

void ngx_stream_proxy_process(ngx_stream_session_t *s,ngx_uint_t from_upstream,ngx_uint_t do_write)

{
  ngx_stream_upstream_t *pnVar1;
  ngx_connection_t *pnVar2;
  ngx_log_handler_pt p_Var3;
  void *pvVar4;
  ngx_int_t nVar5;
  size_t sVar6;
  ulong timer;
  ngx_uint_t nVar7;
  ngx_chain_t *pnVar8;
  char *pcVar9;
  char *pcVar10;
  off_t local_108;
  ngx_connection_t *local_d0;
  ngx_stream_proxy_srv_conf_t *pscf;
  ngx_stream_upstream_t *u;
  ngx_log_handler_pt handler;
  ngx_connection_t *dst;
  ngx_connection_t *src;
  ngx_connection_t *pc;
  ngx_connection_t *c;
  ngx_chain_t **busy;
  ngx_chain_t **out;
  ngx_chain_t **ll;
  ngx_chain_t *cl;
  ngx_msec_t delay;
  ngx_uint_t flags;
  ngx_int_t rc;
  ngx_buf_t *b;
  ssize_t n;
  size_t limit_rate;
  size_t size;
  off_t limit;
  off_t *received;
  ngx_uint_t do_write_local;
  ngx_uint_t from_upstream_local;
  ngx_stream_session_t *s_local;
  
  pnVar1 = s->upstream;
  pnVar2 = s->connection;
  if ((pnVar1->field_0x178 & 1) == 0) {
    local_d0 = (ngx_connection_t *)0x0;
  }
  else {
    local_d0 = (pnVar1->peer).connection;
  }
  if ((pnVar2->type == 2) && ((ngx_terminate != 0 || (ngx_exiting != 0)))) {
    p_Var3 = pnVar2->log->handler;
    pnVar2->log->handler = (ngx_log_handler_pt)0x0;
    if (6 < pnVar2->log->log_level) {
      ngx_log_error_core(7,pnVar2->log,0,"disconnected on shutdown");
    }
    pnVar2->log->handler = p_Var3;
    ngx_stream_proxy_finalize(s,200);
    return;
  }
  pvVar4 = s->srv_conf[ngx_stream_proxy_module.ctx_index];
  received = (off_t *)do_write;
  if (from_upstream == 0) {
    handler = (ngx_log_handler_pt)local_d0;
    rc = (ngx_int_t)&pnVar1->downstream_buf;
    n = *(ssize_t *)((long)pvVar4 + 0x20);
    limit = (off_t)&s->received;
    busy = &pnVar1->upstream_out;
    c = (ngx_connection_t *)&pnVar1->upstream_busy;
    dst = pnVar2;
  }
  else {
    dst = local_d0;
    rc = (ngx_int_t)&pnVar1->upstream_buf;
    n = *(ssize_t *)((long)pvVar4 + 0x28);
    limit = (off_t)&pnVar1->received;
    busy = &pnVar1->downstream_out;
    c = (ngx_connection_t *)&pnVar1->downstream_busy;
    handler = (ngx_log_handler_pt)pnVar2;
  }
  while( true ) {
    if (((received != (off_t *)0x0) && (handler != (ngx_log_handler_pt)0x0)) &&
       ((*busy != (ngx_chain_t *)0x0 ||
        ((c->data != (void *)0x0 || ((*(uint *)(handler + 0xd8) & 0xff) != 0)))))) {
      nVar5 = (*ngx_stream_top_filter)(s,*busy,from_upstream);
      if (nVar5 == -1) {
        if ((pnVar2->type == 2) && (from_upstream == 0)) {
          ngx_stream_proxy_next_upstream(s);
          return;
        }
        ngx_stream_proxy_finalize(s,200);
        return;
      }
      ngx_chain_update_chains
                (pnVar2->pool,&pnVar1->free,(ngx_chain_t **)c,busy,&ngx_stream_proxy_module);
      if (c->data == (void *)0x0) {
        *(undefined8 *)rc = *(undefined8 *)(rc + 0x20);
        *(undefined8 *)(rc + 8) = *(undefined8 *)(rc + 0x20);
      }
    }
    limit_rate = *(long *)(rc + 0x28) - *(long *)(rc + 8);
    if ((((limit_rate == 0) || ((*(uint *)&dst->read->field_0x8 >> 5 & 1) == 0)) ||
        ((*(uint *)&dst->read->field_0x8 >> 0xc & 1) != 0)) ||
       ((*(uint *)&dst->read->field_0x8 >> 9 & 1) != 0)) break;
    if (n != 0) {
      sVar6 = n * ((ngx_cached_time->sec - pnVar1->start_sec) + 1) - *(long *)limit;
      if ((long)sVar6 < 1) {
        *(uint *)&dst->read->field_0x8 = *(uint *)&dst->read->field_0x8 & 0xffffefff | 0x1000;
        ngx_event_add_timer(dst->read,(sVar6 * -1000) / (ulong)n + 1);
        break;
      }
      if ((long)sVar6 < (long)limit_rate) {
        limit_rate = sVar6;
      }
    }
    b = (ngx_buf_t *)(*dst->recv)(dst,*(u_char **)(rc + 8),limit_rate);
    if (b == (ngx_buf_t *)0xfffffffffffffffe) break;
    if (b == (ngx_buf_t *)0xffffffffffffffff) {
      if ((pnVar2->type == 2) && (pnVar1->received == 0)) {
        ngx_stream_proxy_next_upstream(s);
        return;
      }
      *(uint *)&dst->read->field_0x8 = *(uint *)&dst->read->field_0x8 & 0xfffffeff | 0x100;
      b = (ngx_buf_t *)0x0;
    }
    if ((long)b < 0) break;
    if ((n != 0) && (timer = (ulong)((long)b * 1000) / (ulong)n, timer != 0)) {
      *(uint *)&dst->read->field_0x8 = *(uint *)&dst->read->field_0x8 & 0xffffefff | 0x1000;
      ngx_event_add_timer(dst->read,timer);
    }
    if ((from_upstream != 0) && (pnVar1->state->first_byte_time == 0xffffffffffffffff)) {
      pnVar1->state->first_byte_time = ngx_current_msec - pnVar1->state->response_time;
    }
    if ((pnVar2->type == 2) &&
       (nVar7 = pnVar1->responses + 1, pnVar1->responses = nVar7,
       nVar7 == *(ngx_uint_t *)((long)pvVar4 + 0x30))) {
      *(uint *)&dst->read->field_0x8 = *(uint *)&dst->read->field_0x8 & 0xffffffdf;
      *(uint *)&dst->read->field_0x8 = *(uint *)&dst->read->field_0x8 & 0xfffffeff | 0x100;
    }
    for (out = busy; *out != (ngx_chain_t *)0x0; out = &(*out)->next) {
    }
    pnVar8 = ngx_chain_get_free_buf(pnVar2->pool,&pnVar1->free);
    if (pnVar8 == (ngx_chain_t *)0x0) {
      ngx_stream_proxy_finalize(s,500);
      return;
    }
    *out = pnVar8;
    pnVar8->buf->pos = *(u_char **)(rc + 8);
    pnVar8->buf->last = (u_char *)((long)&b->pos + *(long *)(rc + 8));
    pnVar8->buf->tag = &ngx_stream_proxy_module;
    *(ushort *)&pnVar8->buf->field_0x48 =
         *(ushort *)&pnVar8->buf->field_0x48 & 0xfffe | (ushort)(b != (ngx_buf_t *)0x0);
    *(ushort *)&pnVar8->buf->field_0x48 =
         *(ushort *)&pnVar8->buf->field_0x48 & 0xff7f |
         ((ushort)((uint)*(undefined4 *)&dst->read->field_0x8 >> 8) & 1) << 7;
    *(ushort *)&pnVar8->buf->field_0x48 = *(ushort *)&pnVar8->buf->field_0x48 & 0xffdf | 0x20;
    *(long *)limit = (long)&b->pos + *(long *)limit;
    *(long *)(rc + 8) = (long)&b->pos + *(long *)(rc + 8);
    received = (off_t *)&DAT_00000001;
  }
  if ((((*(uint *)&dst->read->field_0x8 >> 8 & 1) != 0) && (handler != (ngx_log_handler_pt)0x0)) &&
     (((*(uint *)(*(long *)(handler + 8) + 8) >> 8 & 1) != 0 ||
      ((*(uint *)(handler + 0xd8) & 0xff) == 0)))) {
    p_Var3 = pnVar2->log->handler;
    pnVar2->log->handler = (ngx_log_handler_pt)0x0;
    if (6 < pnVar2->log->log_level) {
      pcVar9 = "";
      if (dst->type == 2) {
        pcVar9 = "udp ";
      }
      pcVar10 = "client";
      if (from_upstream != 0) {
        pcVar10 = "upstream";
      }
      if (local_d0 == (ngx_connection_t *)0x0) {
        local_108 = 0;
      }
      else {
        local_108 = local_d0->sent;
      }
      ngx_log_error_core(7,pnVar2->log,0,
                         "%s%s disconnected, bytes from/to client:%O/%O, bytes from/to upstream:%O/%O"
                         ,pcVar9,pcVar10,s->received,pnVar2->sent,pnVar1->received,local_108);
    }
    pnVar2->log->handler = p_Var3;
    ngx_stream_proxy_finalize(s,200);
    return;
  }
  if (((*(uint *)&dst->field_0xd8 >> 0x11 & 1) == 0) &&
     (nVar5 = ngx_handle_read_event
                        (dst->read,(long)(int)(uint)((*(uint *)&dst->read->field_0x8 >> 8 & 1) != 0)
                        ), nVar5 != 0)) {
    ngx_stream_proxy_finalize(s,500);
    return;
  }
  if (handler == (ngx_log_handler_pt)0x0) {
    return;
  }
  if (((*(uint *)(handler + 0xd8) >> 0x11 & 1) == 0) &&
     (nVar5 = ngx_handle_write_event(*(ngx_event_t **)(handler + 0x10),0), nVar5 != 0)) {
    ngx_stream_proxy_finalize(s,500);
    return;
  }
  if (((*(uint *)&pnVar2->read->field_0x8 >> 0xc & 1) == 0) &&
     ((*(uint *)&local_d0->read->field_0x8 >> 0xc & 1) == 0)) {
    ngx_event_add_timer(pnVar2->write,*(ngx_msec_t *)((long)pvVar4 + 8));
    return;
  }
  if ((*(uint *)&pnVar2->write->field_0x8 >> 0xb & 1) == 0) {
    return;
  }
  ngx_event_del_timer(pnVar2->write);
  return;
}

Assistant:

static void
ngx_stream_proxy_process(ngx_stream_session_t *s, ngx_uint_t from_upstream,
    ngx_uint_t do_write)
{
    off_t                        *received, limit;
    size_t                        size, limit_rate;
    ssize_t                       n;
    ngx_buf_t                    *b;
    ngx_int_t                     rc;
    ngx_uint_t                    flags;
    ngx_msec_t                    delay;
    ngx_chain_t                  *cl, **ll, **out, **busy;
    ngx_connection_t             *c, *pc, *src, *dst;
    ngx_log_handler_pt            handler;
    ngx_stream_upstream_t        *u;
    ngx_stream_proxy_srv_conf_t  *pscf;

    u = s->upstream;

    c = s->connection;
    pc = u->connected ? u->peer.connection : NULL;

    if (c->type == SOCK_DGRAM && (ngx_terminate || ngx_exiting)) {

        /* socket is already closed on worker shutdown */

        handler = c->log->handler;
        c->log->handler = NULL;

        ngx_log_error(NGX_LOG_INFO, c->log, 0, "disconnected on shutdown");

        c->log->handler = handler;

        ngx_stream_proxy_finalize(s, NGX_STREAM_OK);
        return;
    }

    pscf = ngx_stream_get_module_srv_conf(s, ngx_stream_proxy_module);

    if (from_upstream) {
        src = pc;
        dst = c;
        b = &u->upstream_buf;
        limit_rate = pscf->download_rate;
        received = &u->received;
        out = &u->downstream_out;
        busy = &u->downstream_busy;

    } else {
        src = c;
        dst = pc;
        b = &u->downstream_buf;
        limit_rate = pscf->upload_rate;
        received = &s->received;
        out = &u->upstream_out;
        busy = &u->upstream_busy;
    }

    for ( ;; ) {

        if (do_write && dst) {

            if (*out || *busy || dst->buffered) {
                rc = ngx_stream_top_filter(s, *out, from_upstream);

                if (rc == NGX_ERROR) {
                    if (c->type == SOCK_DGRAM && !from_upstream) {
                        ngx_stream_proxy_next_upstream(s);
                        return;
                    }

                    ngx_stream_proxy_finalize(s, NGX_STREAM_OK);
                    return;
                }

                ngx_chain_update_chains(c->pool, &u->free, busy, out,
                                      (ngx_buf_tag_t) &ngx_stream_proxy_module);

                if (*busy == NULL) {
                    b->pos = b->start;
                    b->last = b->start;
                }
            }
        }

        size = b->end - b->last;

        if (size && src->read->ready && !src->read->delayed
            && !src->read->error)
        {
            if (limit_rate) {
                limit = (off_t) limit_rate * (ngx_time() - u->start_sec + 1)
                        - *received;

                if (limit <= 0) {
                    src->read->delayed = 1;
                    delay = (ngx_msec_t) (- limit * 1000 / limit_rate + 1);
                    ngx_add_timer(src->read, delay);
                    break;
                }

                if ((off_t) size > limit) {
                    size = (size_t) limit;
                }
            }

            n = src->recv(src, b->last, size);

            if (n == NGX_AGAIN) {
                break;
            }

            if (n == NGX_ERROR) {
                if (c->type == SOCK_DGRAM && u->received == 0) {
                    ngx_stream_proxy_next_upstream(s);
                    return;
                }

                src->read->eof = 1;
                n = 0;
            }

            if (n >= 0) {
                if (limit_rate) {
                    delay = (ngx_msec_t) (n * 1000 / limit_rate);

                    if (delay > 0) {
                        src->read->delayed = 1;
                        ngx_add_timer(src->read, delay);
                    }
                }

                if (from_upstream) {
                    if (u->state->first_byte_time == (ngx_msec_t) -1) {
                        u->state->first_byte_time = ngx_current_msec
                                                    - u->state->response_time;
                    }
                }

                if (c->type == SOCK_DGRAM && ++u->responses == pscf->responses)
                {
                    src->read->ready = 0;
                    src->read->eof = 1;
                }

                for (ll = out; *ll; ll = &(*ll)->next) { /* void */ }

                cl = ngx_chain_get_free_buf(c->pool, &u->free);
                if (cl == NULL) {
                    ngx_stream_proxy_finalize(s,
                                              NGX_STREAM_INTERNAL_SERVER_ERROR);
                    return;
                }

                *ll = cl;

                cl->buf->pos = b->last;
                cl->buf->last = b->last + n;
                cl->buf->tag = (ngx_buf_tag_t) &ngx_stream_proxy_module;

                cl->buf->temporary = (n ? 1 : 0);
                cl->buf->last_buf = src->read->eof;
                cl->buf->flush = 1;

                *received += n;
                b->last += n;
                do_write = 1;

                continue;
            }
        }

        break;
    }

    if (src->read->eof && dst && (dst->read->eof || !dst->buffered)) {
        handler = c->log->handler;
        c->log->handler = NULL;

        ngx_log_error(NGX_LOG_INFO, c->log, 0,
                      "%s%s disconnected"
                      ", bytes from/to client:%O/%O"
                      ", bytes from/to upstream:%O/%O",
                      src->type == SOCK_DGRAM ? "udp " : "",
                      from_upstream ? "upstream" : "client",
                      s->received, c->sent, u->received, pc ? pc->sent : 0);

        c->log->handler = handler;

        ngx_stream_proxy_finalize(s, NGX_STREAM_OK);
        return;
    }

    flags = src->read->eof ? NGX_CLOSE_EVENT : 0;

    if (!src->shared && ngx_handle_read_event(src->read, flags) != NGX_OK) {
        ngx_stream_proxy_finalize(s, NGX_STREAM_INTERNAL_SERVER_ERROR);
        return;
    }

    if (dst) {
        if (!dst->shared && ngx_handle_write_event(dst->write, 0) != NGX_OK) {
            ngx_stream_proxy_finalize(s, NGX_STREAM_INTERNAL_SERVER_ERROR);
            return;
        }

        if (!c->read->delayed && !pc->read->delayed) {
            ngx_add_timer(c->write, pscf->timeout);

        } else if (c->write->timer_set) {
            ngx_del_timer(c->write);
        }
    }
}